

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O2

void add_section(int pass,section_type_t type,int address,int bank)

{
  section_t *psVar1;
  section_s *psVar2;
  section_t **ppsVar3;
  block_header_t header;
  
  if (pass == 1) {
    psVar2 = (section_s *)malloc(0x20);
    if (psVar2 == (section_s *)0x0) {
      ccerr(F,"unable to allocate memory");
    }
    ppsVar3 = &cur->next;
    if (root == (section_t *)0x0) {
      ppsVar3 = &root;
    }
    *ppsVar3 = psVar2;
    cur = psVar2;
    psVar2->type = type;
    psVar2->id = num_sections;
    psVar2->offset = address;
    psVar2->bank = bank;
    num_sections = num_sections + 1;
    psVar2->datasize = 0;
    psVar2->pc = 0;
    psVar2->next = (section_s *)0x0;
  }
  else {
    cur = cur->next;
    if (cur == (section_s *)0x0) {
      header = (block_header_t)((ulong)(uint)num_sections << 0x20);
      cur = root;
      write_block_header(&header);
    }
    psVar1 = cur;
    cur->pc = 0;
    header.type = psVar1->id;
    header.num_entries = psVar1->type;
    write_section_entry((section_entry_t *)&header);
  }
  return;
}

Assistant:

void add_section(int pass, section_type_t type, int address, int bank)
{
    section_entry_t sect_entry;
    
    /* PASS 1 : Create a new section */
    if (pass == READ_PASS)
    {
        section_t* new = (section_t*)malloc(sizeof(section_t));
        if (new == NULL)
            ccerr(F, "unable to allocate memory");

        if (!root)
        {
            root = new;
            cur = root;
        }
        else
        {
            cur->next = new;
            cur = cur->next;
        }

        cur->type = type;
        cur->id = num_sections;
        cur->offset = address;
        cur->bank = bank;
        cur->pc = 0;
        cur->datasize = 0;
        cur->next = NULL;
        ++num_sections;
    }
    else /* PASS 2 */
    {
        if (cur->next == NULL) /* First section : write the block header */
        {
            block_header_t header;
            header.type = sections;
            header.num_entries = num_sections;
            cur = root;
            write_block_header(&header);
        }
        else
            cur = cur->next;

        cur->pc = 0;

        /* New section : use new header */
        sect_entry.id = cur->id;
        sect_entry.type = cur->type;
        sect_entry.offset = cur->offset;
        sect_entry.bank_num = cur->bank;
        sect_entry.data_size = cur->datasize;
        write_section_entry(&sect_entry);
    }
}